

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

void __thiscall QtMWidgets::PickerPrivate::computeStringWidth(PickerPrivate *this)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  int iVar4;
  int extraout_EDX;
  int index;
  undefined1 local_50 [32];
  
  this->maxStringWidth = 0x19;
  pPVar1 = (this->q->d).d;
  pQVar2 = pPVar1->model;
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)(local_50 + 8),&pPVar1->root);
  iVar3 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,(QModelIndex *)(local_50 + 8));
  if (0 < iVar3) {
    QFontMetrics::QFontMetrics
              ((QFontMetrics *)local_50,(QFont *)(*(long *)&this->q->field_0x20 + 0x38));
    index = 0;
    do {
      Picker::itemText((QString *)(local_50 + 8),this->q,index);
      iVar4 = QFontMetrics::boundingRect((QString *)local_50);
      if ((QArrayData *)local_50._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_50._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_50._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_50._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_50._8_8_,2,8);
        }
      }
      iVar4 = (extraout_EDX - iVar4) + 1;
      if (this->maxStringWidth < iVar4) {
        this->maxStringWidth = iVar4;
      }
      index = index + 1;
    } while (iVar3 != index);
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_50);
  }
  return;
}

Assistant:

void
PickerPrivate::computeStringWidth()
{
	maxStringWidth = 25;

	const int rowCount = q->count();

	if( rowCount > 0 )
	{
		const QFontMetrics & fm = q->fontMetrics();

		for( int i = 0; i < rowCount; ++i )
		{
			const int width = fm.boundingRect( q->itemText( i ) ).width();

			if( width > maxStringWidth )
				maxStringWidth = width;
		}
	}
}